

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O0

int __thiscall crnlib::cfile_stream::close(cfile_stream *this,int __fd)

{
  int iVar1;
  bool local_19;
  bool status;
  cfile_stream *this_local;
  
  data_stream::clear_error(&this->super_data_stream);
  if (((this->super_data_stream).field_0x1a & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_19 = true;
    if ((this->m_has_ownership & 1U) != 0) {
      iVar1 = fclose((FILE *)this->m_pFile);
      local_19 = iVar1 != -1;
    }
    this->m_pFile = (FILE *)0x0;
    (this->super_data_stream).field_0x1a = (this->super_data_stream).field_0x1a & 0xfe;
    this->m_size = 0;
    this->m_ofs = 0;
    this->m_has_ownership = false;
    this_local._7_1_ = local_19;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

virtual bool close()
        {
            clear_error();

            if (m_opened)
            {
                bool status = true;
                if (m_has_ownership)
                {
                    if (EOF == fclose(m_pFile))
                    {
                        status = false;
                    }
                }

                m_pFile = nullptr;
                m_opened = false;
                m_size = 0;
                m_ofs = 0;
                m_has_ownership = false;

                return status;
            }

            return false;
        }